

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::utils::RegistryWithPred<el::Configuration,_el::Configuration::Predicate>::unregisterAll
          (RegistryWithPred<el::Configuration,_el::Configuration::Predicate> *this)

{
  bool bVar1;
  ulong uVar2;
  __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  *in_RDI;
  Configuration **curr;
  iterator __end0;
  iterator __begin0;
  vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *__range4;
  vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  local_18;
  undefined8 local_10;
  
  uVar2 = (*(code *)in_RDI->_M_current[9])();
  if ((uVar2 & 1) == 0) {
    local_10 = (*(code *)in_RDI->_M_current[0xb])();
    local_18._M_current =
         (Configuration **)
         std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::begin
                   (in_stack_ffffffffffffffc8);
    std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::end
              (in_stack_ffffffffffffffc8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_RDI,(__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                                 *)in_stack_ffffffffffffffc8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
      ::operator*(&local_18);
      safeDelete<el::Configuration>((Configuration **)in_RDI);
      __gnu_cxx::
      __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
      ::operator++(&local_18);
    }
    (*(code *)in_RDI->_M_current[0xb])();
    std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::clear
              ((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)0x27ba38);
  }
  return;
}

Assistant:

virtual void unregisterAll(void) ELPP_FINAL {
    if (!this->empty()) {
      for (auto&& curr : this->list()) {
        base::utils::safeDelete(curr);
      }
      this->list().clear();
    }
  }